

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<double,__1,__1,_1,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
_set_noalias<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *this,
          DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *other)

{
  assign_op<double,_double> *func;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *src;
  Matrix<double,__1,__1,_1,__1,__1> *pMVar1;
  EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *in_RSI;
  EigenBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *in_RDI;
  assign_op<double,_double> local_11;
  EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *local_10;
  
  local_10 = in_RSI;
  func = (assign_op<double,_double> *)
         EigenBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::derived(in_RDI);
  src = EigenBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::derived(local_10);
  internal::assign_op<double,_double>::assign_op(&local_11);
  internal::
  call_assignment_no_alias<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)in_RDI,src,func);
  pMVar1 = EigenBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::derived(in_RDI);
  return pMVar1;
}

Assistant:

EIGEN_DEVICE_FUNC 
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }